

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O1

bool __thiscall
cmConditionEvaluator::HandleLevel2
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *errorString,
          MessageType *status)

{
  iterator iVar1;
  iterator iVar2;
  bool bVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  cmConditionEvaluator *pcVar7;
  cmConditionEvaluator *pcVar8;
  string *psVar9;
  char *pcVar10;
  cmConditionEvaluator *pcVar11;
  ostream *poVar12;
  size_t sVar13;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var14;
  PolicyID id;
  cmState *pcVar15;
  element_type *peVar16;
  cmConditionEvaluator *this_00;
  cmMakefile *pcVar17;
  cmExpandedCommandArgument *pcVar18;
  cmExpandedCommandArgument *argument;
  iterator argP2;
  iterator argP1;
  iterator arg;
  int reducible;
  char *def;
  string def_buf;
  RegularExpression regEntry;
  ostringstream error;
  iterator local_360;
  iterator local_358;
  iterator local_350;
  int local_348;
  char local_341;
  cmConditionEvaluator *local_340;
  cmConditionEvaluator *local_338;
  _List_node_base *local_330;
  cmConditionEvaluator *local_328;
  char *local_320;
  undefined1 local_318 [64];
  undefined1 local_2d8 [32];
  undefined1 local_2b8 [32];
  undefined1 local_298 [80];
  char *local_248;
  char *local_1f8;
  char *local_1d8;
  _Base_ptr local_1c8 [2];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [32];
  bool local_188;
  ios_base local_138 [264];
  
  local_328 = (cmConditionEvaluator *)local_318;
  local_320 = (char *)0x0;
  local_318[0] = 0;
  local_340 = this;
  local_2b8._16_8_ = errorString;
  local_2b8._24_8_ = status;
  do {
    local_348 = 0;
    local_350._M_node =
         (newArgs->
         super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>).
         _M_impl._M_node.super__List_node_base._M_next;
    local_358._M_node = (_List_node_base *)0x0;
    local_360._M_node = (_List_node_base *)0x0;
    for (; bVar5 = local_350._M_node == (_List_node_base *)newArgs, !bVar5;
        local_350._M_node =
             (((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
              &(local_350._M_node)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
      local_358._M_node = local_350._M_node;
      if ((local_350._M_node != (_List_node_base *)newArgs) &&
         (local_358._M_node =
               (((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                  *)&(local_350._M_node)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
         local_360._M_node = local_358._M_node, local_358._M_node != (_List_node_base *)newArgs)) {
        local_360._M_node = (local_358._M_node)->_M_next;
      }
      iVar2._M_node = local_358._M_node;
      iVar1._M_node = local_360._M_node;
      if (((local_358._M_node != (_List_node_base *)newArgs) &&
          (local_360._M_node != (_List_node_base *)newArgs)) &&
         (bVar3 = IsKeyword(local_340,&keyMATCHES_abi_cxx11_,
                            (cmExpandedCommandArgument *)(local_358._M_node + 1)), bVar3)) {
        local_330 = local_350._M_node;
        pcVar18 = (cmExpandedCommandArgument *)(local_350._M_node + 1);
        pcVar7 = (cmConditionEvaluator *)GetDefinitionIfUnquoted(local_340,pcVar18);
        if (pcVar7 == (cmConditionEvaluator *)0x0) {
          pcVar7 = (cmConditionEvaluator *)cmExpandedCommandArgument::c_str(pcVar18);
        }
        local_338 = pcVar7;
        pcVar8 = (cmConditionEvaluator *)cmExpandedCommandArgument::c_str(pcVar18);
        if (pcVar7 != pcVar8) {
          psVar9 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar18);
          iVar6 = strncmp((psVar9->_M_dataplus)._M_p,"CMAKE_MATCH_",0xc);
          pcVar10 = local_320;
          pcVar7 = local_338;
          if (iVar6 == 0) {
            strlen((char *)local_338);
            std::__cxx11::string::_M_replace((ulong)&local_328,0,pcVar10,(ulong)pcVar7);
            local_338 = local_328;
          }
        }
        pcVar10 = cmExpandedCommandArgument::c_str((cmExpandedCommandArgument *)(iVar1._M_node + 1))
        ;
        cmMakefile::ClearMatches(local_340->Makefile);
        local_298._0_8_ = (pointer)0x0;
        local_248 = (char *)0x0;
        local_1f8 = (char *)0x0;
        local_1d8 = (char *)0x0;
        cVar4 = cmsys::RegularExpression::compile((RegularExpression *)local_298,pcVar10);
        if ((bool)cVar4) {
          bVar3 = cmsys::RegularExpression::find
                            ((RegularExpression *)local_298,(char *)local_338,
                             (RegularExpressionMatch *)local_298);
          local_341 = cVar4;
          if (bVar3) {
            cmMakefile::StoreMatches(local_340->Makefile,(RegularExpression *)local_298);
            local_2d8._16_8_ = local_2b8;
            std::__cxx11::string::_M_construct<char_const*>((string *)(local_2d8 + 0x10),"1","");
            cmExpandedCommandArgument::cmExpandedCommandArgument
                      ((cmExpandedCommandArgument *)local_1a8,(string *)(local_2d8 + 0x10),true);
            std::__cxx11::string::operator=((string *)pcVar18,(string *)local_1a8);
            *(bool *)&local_330[3]._M_next = local_188;
            if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
              operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
            }
            pcVar15 = (cmState *)local_2b8._0_8_;
            peVar16 = (element_type *)local_2d8._16_8_;
            if ((element_type *)local_2d8._16_8_ != (element_type *)local_2b8) {
LAB_003eb49d:
              operator_delete(peVar16,(ulong)&(pcVar15->PropertyDefinitions)._M_t._M_impl.field_0x1)
              ;
            }
          }
          else {
            local_318._48_8_ = local_2d8;
            std::__cxx11::string::_M_construct<char_const*>((string *)(local_318 + 0x30),"0","");
            cmExpandedCommandArgument::cmExpandedCommandArgument
                      ((cmExpandedCommandArgument *)local_1a8,(string *)(local_318 + 0x30),true);
            std::__cxx11::string::operator=((string *)pcVar18,(string *)local_1a8);
            *(bool *)&local_330[3]._M_next = local_188;
            if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
              operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
            }
            pcVar15 = (cmState *)local_2d8._0_8_;
            peVar16 = (element_type *)local_318._48_8_;
            if ((element_type *)local_318._48_8_ != (element_type *)local_2d8) goto LAB_003eb49d;
          }
          std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
          ::_M_erase(newArgs,iVar1);
          std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
          ::_M_erase(newArgs,iVar2);
          local_358._M_node = local_350._M_node;
          if ((local_350._M_node != (_List_node_base *)newArgs) &&
             (local_358._M_node =
                   (((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                      *)&(local_350._M_node)->_M_next)->_M_impl)._M_node.super__List_node_base.
                   _M_next, local_360._M_node = local_358._M_node,
             local_358._M_node != (_List_node_base *)newArgs)) {
            local_360._M_node = (local_358._M_node)->_M_next;
          }
          local_348 = 1;
          cVar4 = local_341;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Regular expression \"",0x14);
          if (pcVar10 == (char *)0x0) {
            std::ios::clear((int)&stack0xfffffffffffffc88 +
                            (int)*(undefined8 *)(local_1a8._0_8_ + -0x18) + 0x1d0);
          }
          else {
            sVar13 = strlen(pcVar10);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar10,sVar13);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"\" cannot compile",0x10);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::operator=((string *)local_2b8._16_8_,(string *)local_1c8);
          if (local_1c8[0] != (_Base_ptr)local_1b8) {
            operator_delete(local_1c8[0],local_1b8._0_8_ + 1);
          }
          *(MessageType *)local_2b8._24_8_ = FATAL_ERROR;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
        }
        if (local_1d8 != (char *)0x0) {
          operator_delete__(local_1d8);
        }
        if (cVar4 == '\0') goto LAB_003ebf54;
      }
      pcVar7 = local_340;
      iVar2._M_node = local_350._M_node;
      iVar1._M_node = local_358._M_node;
      if (local_358._M_node != (_List_node_base *)newArgs) {
        pcVar18 = (cmExpandedCommandArgument *)(local_350._M_node + 1);
        bVar5 = IsKeyword(local_340,&keyMATCHES_abi_cxx11_,pcVar18);
        if (bVar5) {
          local_318._16_8_ = local_318 + 0x20;
          std::__cxx11::string::_M_construct<char_const*>((string *)(local_318 + 0x10),"0","");
          cmExpandedCommandArgument::cmExpandedCommandArgument
                    ((cmExpandedCommandArgument *)local_1a8,(string *)(local_318 + 0x10),true);
          std::__cxx11::string::operator=((string *)pcVar18,(string *)local_1a8);
          *(bool *)&iVar2._M_node[3]._M_next = local_188;
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          if ((undefined1 *)local_318._16_8_ != local_318 + 0x20) {
            operator_delete((void *)local_318._16_8_,local_318._32_8_ + 1);
          }
          std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
          ::_M_erase(newArgs,iVar1);
          local_358._M_node = local_350._M_node;
          if ((local_350._M_node != (_List_node_base *)newArgs) &&
             (local_358._M_node = (local_350._M_node)->_M_next,
             local_360._M_node = local_358._M_node, local_358._M_node != (_List_node_base *)newArgs)
             ) {
            local_360._M_node = (local_358._M_node)->_M_next;
          }
          local_348 = 1;
        }
      }
      iVar1._M_node = local_360._M_node;
      if ((local_358._M_node != (_List_node_base *)newArgs) &&
         (local_360._M_node != (_List_node_base *)newArgs)) {
        pcVar8 = (cmConditionEvaluator *)(local_358._M_node + 1);
        bVar5 = IsKeyword(pcVar7,&keyLESS_abi_cxx11_,(cmExpandedCommandArgument *)pcVar8);
        if ((bVar5) ||
           ((((bVar5 = IsKeyword(pcVar7,&keyLESS_EQUAL_abi_cxx11_,
                                 (cmExpandedCommandArgument *)pcVar8), bVar5 ||
              (bVar5 = IsKeyword(pcVar7,&keyGREATER_abi_cxx11_,(cmExpandedCommandArgument *)pcVar8),
              bVar5)) ||
             (bVar5 = IsKeyword(pcVar7,&keyGREATER_EQUAL_abi_cxx11_,
                                (cmExpandedCommandArgument *)pcVar8), bVar5)) ||
            (bVar5 = IsKeyword(pcVar7,&keyEQUAL_abi_cxx11_,(cmExpandedCommandArgument *)pcVar8),
            bVar5)))) {
          pcVar18 = (cmExpandedCommandArgument *)(local_350._M_node + 1);
          pcVar7 = (cmConditionEvaluator *)GetDefinitionIfUnquoted(pcVar7,pcVar18);
          if (pcVar7 == (cmConditionEvaluator *)0x0) {
            pcVar7 = (cmConditionEvaluator *)cmExpandedCommandArgument::c_str(pcVar18);
          }
          local_338 = pcVar7;
          pcVar11 = (cmConditionEvaluator *)
                    GetDefinitionIfUnquoted
                              (local_340,(cmExpandedCommandArgument *)(iVar1._M_node + 1));
          if (pcVar11 == (cmConditionEvaluator *)0x0) {
            pcVar11 = (cmConditionEvaluator *)
                      cmExpandedCommandArgument::c_str
                                ((cmExpandedCommandArgument *)(iVar1._M_node + 1));
          }
          bVar5 = false;
          this_00 = local_338;
          iVar6 = __isoc99_sscanf(local_338,"%lg",local_1a8);
          pcVar7 = local_340;
          if (iVar6 == 1) {
            bVar5 = false;
            iVar6 = __isoc99_sscanf(pcVar11,"%lg",local_298);
            this_00 = pcVar11;
            if (iVar6 == 1) {
              this_00 = pcVar8;
              bVar5 = cmExpandedCommandArgument::operator==
                                ((cmExpandedCommandArgument *)pcVar8,&keyLESS_abi_cxx11_);
              if (bVar5) {
                bVar5 = (double)local_298._0_8_ == (double)local_1a8._0_8_;
                bVar3 = (double)local_298._0_8_ < (double)local_1a8._0_8_;
LAB_003eb83d:
                bVar5 = !bVar3 && !bVar5;
              }
              else {
                pcVar11 = pcVar8;
                bVar5 = cmExpandedCommandArgument::operator==
                                  ((cmExpandedCommandArgument *)pcVar8,&keyLESS_EQUAL_abi_cxx11_);
                if (bVar5) {
                  bVar5 = (double)local_298._0_8_ < (double)local_1a8._0_8_;
                  pcVar8 = pcVar11;
                }
                else {
                  this_00 = pcVar8;
                  bVar5 = cmExpandedCommandArgument::operator==
                                    ((cmExpandedCommandArgument *)pcVar8,&keyGREATER_abi_cxx11_);
                  if (bVar5) {
                    bVar5 = (double)local_1a8._0_8_ == (double)local_298._0_8_;
                    bVar3 = (double)local_1a8._0_8_ < (double)local_298._0_8_;
                    goto LAB_003eb83d;
                  }
                  bVar5 = cmExpandedCommandArgument::operator==
                                    ((cmExpandedCommandArgument *)pcVar8,
                                     &keyGREATER_EQUAL_abi_cxx11_);
                  if (!bVar5) {
                    bVar5 = (bool)(-((double)local_1a8._0_8_ == (double)local_298._0_8_) & 1);
                    this_00 = pcVar8;
                    goto LAB_003eb870;
                  }
                  bVar5 = (double)local_1a8._0_8_ < (double)local_298._0_8_;
                }
                bVar5 = !bVar5;
                this_00 = pcVar8;
              }
            }
          }
LAB_003eb870:
          HandleBinaryOp(this_00,bVar5,&local_348,&local_350,newArgs,&local_358,&local_360);
        }
      }
      iVar1._M_node = local_360._M_node;
      if ((local_358._M_node != (_List_node_base *)newArgs) &&
         (local_360._M_node != (_List_node_base *)newArgs)) {
        pcVar8 = (cmConditionEvaluator *)(local_358._M_node + 1);
        bVar5 = IsKeyword(pcVar7,&keySTRLESS_abi_cxx11_,(cmExpandedCommandArgument *)pcVar8);
        if ((((bVar5) ||
             ((bVar5 = IsKeyword(pcVar7,&keySTRLESS_EQUAL_abi_cxx11_,
                                 (cmExpandedCommandArgument *)pcVar8), bVar5 ||
              (bVar5 = IsKeyword(pcVar7,&keySTRGREATER_abi_cxx11_,
                                 (cmExpandedCommandArgument *)pcVar8), bVar5)))) ||
            (bVar5 = IsKeyword(pcVar7,&keySTRGREATER_EQUAL_abi_cxx11_,
                               (cmExpandedCommandArgument *)pcVar8), bVar5)) ||
           (bVar5 = IsKeyword(pcVar7,&keySTREQUAL_abi_cxx11_,(cmExpandedCommandArgument *)pcVar8),
           bVar5)) {
          pcVar18 = (cmExpandedCommandArgument *)(local_350._M_node + 1);
          pcVar7 = (cmConditionEvaluator *)GetDefinitionIfUnquoted(pcVar7,pcVar18);
          if (pcVar7 == (cmConditionEvaluator *)0x0) {
            pcVar7 = (cmConditionEvaluator *)cmExpandedCommandArgument::c_str(pcVar18);
          }
          local_338 = pcVar7;
          pcVar10 = GetDefinitionIfUnquoted
                              (local_340,(cmExpandedCommandArgument *)(iVar1._M_node + 1));
          if (pcVar10 == (char *)0x0) {
            pcVar10 = cmExpandedCommandArgument::c_str
                                ((cmExpandedCommandArgument *)(iVar1._M_node + 1));
          }
          iVar6 = strcmp((char *)local_338,pcVar10);
          pcVar11 = pcVar8;
          bVar5 = cmExpandedCommandArgument::operator==
                            ((cmExpandedCommandArgument *)pcVar8,&keySTRLESS_abi_cxx11_);
          pcVar7 = local_340;
          if (bVar5) {
            bVar5 = SUB41((uint)iVar6 >> 0x1f,0);
            pcVar8 = pcVar11;
          }
          else {
            pcVar11 = pcVar8;
            bVar5 = cmExpandedCommandArgument::operator==
                              ((cmExpandedCommandArgument *)pcVar8,&keySTRLESS_EQUAL_abi_cxx11_);
            if (bVar5) {
              bVar5 = iVar6 < 1;
              pcVar8 = pcVar11;
            }
            else {
              pcVar11 = pcVar8;
              bVar5 = cmExpandedCommandArgument::operator==
                                ((cmExpandedCommandArgument *)pcVar8,&keySTRGREATER_abi_cxx11_);
              if (bVar5) {
                bVar5 = 0 < iVar6;
                pcVar8 = pcVar11;
              }
              else {
                bVar5 = cmExpandedCommandArgument::operator==
                                  ((cmExpandedCommandArgument *)pcVar8,
                                   &keySTRGREATER_EQUAL_abi_cxx11_);
                if (bVar5) {
                  bVar5 = -1 < iVar6;
                }
                else {
                  bVar5 = iVar6 == 0;
                }
              }
            }
          }
          HandleBinaryOp(pcVar8,bVar5,&local_348,&local_350,newArgs,&local_358,&local_360);
        }
      }
      iVar1._M_node = local_360._M_node;
      if ((local_358._M_node != (_List_node_base *)newArgs) &&
         (local_360._M_node != (_List_node_base *)newArgs)) {
        pcVar18 = (cmExpandedCommandArgument *)(local_358._M_node + 1);
        bVar5 = IsKeyword(pcVar7,&keyVERSION_LESS_abi_cxx11_,pcVar18);
        if (((bVar5) ||
            (((bVar5 = IsKeyword(pcVar7,&keyVERSION_LESS_EQUAL_abi_cxx11_,pcVar18), bVar5 ||
              (bVar5 = IsKeyword(pcVar7,&keyVERSION_GREATER_abi_cxx11_,pcVar18), bVar5)) ||
             (bVar5 = IsKeyword(pcVar7,&keyVERSION_GREATER_EQUAL_abi_cxx11_,pcVar18), bVar5)))) ||
           (bVar5 = IsKeyword(pcVar7,&keyVERSION_EQUAL_abi_cxx11_,pcVar18), bVar5)) {
          argument = (cmExpandedCommandArgument *)(local_350._M_node + 1);
          pcVar7 = (cmConditionEvaluator *)GetDefinitionIfUnquoted(pcVar7,argument);
          if (pcVar7 == (cmConditionEvaluator *)0x0) {
            pcVar7 = (cmConditionEvaluator *)cmExpandedCommandArgument::c_str(argument);
          }
          local_338 = pcVar7;
          pcVar10 = GetDefinitionIfUnquoted
                              (local_340,(cmExpandedCommandArgument *)(iVar1._M_node + 1));
          if (pcVar10 == (char *)0x0) {
            pcVar10 = cmExpandedCommandArgument::c_str
                                ((cmExpandedCommandArgument *)(iVar1._M_node + 1));
          }
          bVar5 = cmExpandedCommandArgument::operator==(pcVar18,&keyVERSION_LESS_abi_cxx11_);
          pcVar8 = (cmConditionEvaluator *)0x2;
          if (!bVar5) {
            bVar5 = cmExpandedCommandArgument::operator==(pcVar18,&keyVERSION_LESS_EQUAL_abi_cxx11_)
            ;
            pcVar8 = (cmConditionEvaluator *)0x3;
            if (!bVar5) {
              bVar5 = cmExpandedCommandArgument::operator==(pcVar18,&keyVERSION_GREATER_abi_cxx11_);
              pcVar8 = (cmConditionEvaluator *)&DAT_00000004;
              if (!bVar5) {
                bVar5 = cmExpandedCommandArgument::operator==
                                  (pcVar18,&keyVERSION_GREATER_EQUAL_abi_cxx11_);
                pcVar8 = (cmConditionEvaluator *)(ulong)((uint)bVar5 * 4 + 1);
              }
            }
          }
          bVar5 = cmSystemTools::VersionCompare((CompareOp)pcVar8,(char *)local_338,pcVar10);
          pcVar7 = local_340;
          HandleBinaryOp(pcVar8,bVar5,&local_348,&local_350,newArgs,&local_358,&local_360);
        }
      }
      iVar1._M_node = local_360._M_node;
      if (((local_358._M_node != (_List_node_base *)newArgs) &&
          (local_360._M_node != (_List_node_base *)newArgs)) &&
         (bVar5 = IsKeyword(pcVar7,&keyIS_NEWER_THAN_abi_cxx11_,
                            (cmExpandedCommandArgument *)(local_358._M_node + 1)), bVar5)) {
        local_1a8._0_8_ = local_1a8._0_8_ & 0xffffffff00000000;
        pcVar8 = (cmConditionEvaluator *)
                 cmExpandedCommandArgument::GetValue_abi_cxx11_
                           ((cmExpandedCommandArgument *)(local_350._M_node + 1));
        psVar9 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                           ((cmExpandedCommandArgument *)(iVar1._M_node + 1));
        bVar5 = cmsys::SystemTools::FileTimeCompare((string *)pcVar8,psVar9,(int *)local_1a8);
        HandleBinaryOp(pcVar8,(uint)local_1a8._0_4_ < 2 || !bVar5,&local_348,&local_350,newArgs,
                       &local_358,&local_360);
      }
      iVar1._M_node = local_360._M_node;
      if (((local_358._M_node != (_List_node_base *)newArgs) &&
          (local_360._M_node != (_List_node_base *)newArgs)) &&
         (bVar5 = IsKeyword(pcVar7,&keyIN_LIST_abi_cxx11_,
                            (cmExpandedCommandArgument *)(local_358._M_node + 1)), bVar5)) {
        if (pcVar7->Policy57Status < NEW) {
          if (pcVar7->Policy57Status == WARN) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_298,(cmPolicies *)0x39,id);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,(char *)local_298._0_8_,local_298._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
            if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
              operator_delete((void *)local_298._0_8_,(ulong)(local_298._16_8_ + 1));
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "IN_LIST will be interpreted as an operator when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
                       ,0x85);
            pcVar17 = pcVar7->Makefile;
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(pcVar17,AUTHOR_WARNING,(string *)local_298);
            if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
              operator_delete((void *)local_298._0_8_,(ulong)(local_298._16_8_ + 1));
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
          }
        }
        else {
          pcVar18 = (cmExpandedCommandArgument *)(local_350._M_node + 1);
          pcVar8 = (cmConditionEvaluator *)GetDefinitionIfUnquoted(pcVar7,pcVar18);
          if (pcVar8 == (cmConditionEvaluator *)0x0) {
            pcVar8 = (cmConditionEvaluator *)cmExpandedCommandArgument::c_str(pcVar18);
          }
          pcVar17 = pcVar7->Makefile;
          local_338 = pcVar8;
          psVar9 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                             ((cmExpandedCommandArgument *)(iVar1._M_node + 1));
          pcVar10 = cmMakefile::GetDefinition(pcVar17,psVar9);
          if (pcVar10 == (char *)0x0) {
            bVar5 = false;
          }
          else {
            local_298._0_8_ = (pointer)0x0;
            local_298._8_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_298._16_8_ = (char *)0x0;
            local_1a8._0_8_ = local_1a8 + 0x10;
            sVar13 = strlen(pcVar10);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1a8,pcVar10,pcVar10 + sVar13);
            cmSystemTools::ExpandListArgument
                      ((string *)local_1a8,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_298,true);
            if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
              operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
            }
            _Var14 = std::
                     __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const*const>>
                               (local_298._0_8_,local_298._8_8_,&local_338);
            bVar5 = _Var14._M_current !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_298._8_8_;
            pcVar17 = (cmMakefile *)local_298;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)pcVar17);
          }
          HandleBinaryOp((cmConditionEvaluator *)pcVar17,bVar5,&local_348,&local_350,newArgs,
                         &local_358,&local_360);
        }
      }
    }
  } while (local_348 != 0);
LAB_003ebf54:
  if (local_328 != (cmConditionEvaluator *)local_318) {
    operator_delete(local_328,CONCAT71(local_318._1_7_,local_318[0]) + 1);
  }
  return bVar5;
}

Assistant:

bool cmConditionEvaluator::HandleLevel2(cmArgumentList& newArgs,
                                        std::string& errorString,
                                        MessageType& status)
{
  int reducible;
  std::string def_buf;
  const char* def;
  const char* def2;
  do {
    reducible = 0;
    cmArgumentList::iterator arg = newArgs.begin();
    cmArgumentList::iterator argP1;
    cmArgumentList::iterator argP2;
    while (arg != newArgs.end()) {
      argP1 = arg;
      this->IncrementArguments(newArgs, argP1, argP2);
      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
          IsKeyword(keyMATCHES, *argP1)) {
        def = this->GetVariableOrString(*arg);
        if (def != arg->c_str() // yes, we compare the pointer value
            && cmHasLiteralPrefix(arg->GetValue(), "CMAKE_MATCH_")) {
          // The string to match is owned by our match result variables.
          // Move it to our own buffer before clearing them.
          def_buf = def;
          def = def_buf.c_str();
        }
        const char* rex = argP2->c_str();
        this->Makefile.ClearMatches();
        cmsys::RegularExpression regEntry;
        if (!regEntry.compile(rex)) {
          std::ostringstream error;
          error << "Regular expression \"" << rex << "\" cannot compile";
          errorString = error.str();
          status = MessageType::FATAL_ERROR;
          return false;
        }
        if (regEntry.find(def)) {
          this->Makefile.StoreMatches(regEntry);
          *arg = cmExpandedCommandArgument("1", true);
        } else {
          *arg = cmExpandedCommandArgument("0", true);
        }
        newArgs.erase(argP2);
        newArgs.erase(argP1);
        argP1 = arg;
        this->IncrementArguments(newArgs, argP1, argP2);
        reducible = 1;
      }

      if (argP1 != newArgs.end() && this->IsKeyword(keyMATCHES, *arg)) {
        *arg = cmExpandedCommandArgument("0", true);
        newArgs.erase(argP1);
        argP1 = arg;
        this->IncrementArguments(newArgs, argP1, argP2);
        reducible = 1;
      }

      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
          (this->IsKeyword(keyLESS, *argP1) ||
           this->IsKeyword(keyLESS_EQUAL, *argP1) ||
           this->IsKeyword(keyGREATER, *argP1) ||
           this->IsKeyword(keyGREATER_EQUAL, *argP1) ||
           this->IsKeyword(keyEQUAL, *argP1))) {
        def = this->GetVariableOrString(*arg);
        def2 = this->GetVariableOrString(*argP2);
        double lhs;
        double rhs;
        bool result;
        if (sscanf(def, "%lg", &lhs) != 1 || sscanf(def2, "%lg", &rhs) != 1) {
          result = false;
        } else if (*(argP1) == keyLESS) {
          result = (lhs < rhs);
        } else if (*(argP1) == keyLESS_EQUAL) {
          result = (lhs <= rhs);
        } else if (*(argP1) == keyGREATER) {
          result = (lhs > rhs);
        } else if (*(argP1) == keyGREATER_EQUAL) {
          result = (lhs >= rhs);
        } else {
          result = (lhs == rhs);
        }
        this->HandleBinaryOp(result, reducible, arg, newArgs, argP1, argP2);
      }

      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
          (this->IsKeyword(keySTRLESS, *argP1) ||
           this->IsKeyword(keySTRLESS_EQUAL, *argP1) ||
           this->IsKeyword(keySTRGREATER, *argP1) ||
           this->IsKeyword(keySTRGREATER_EQUAL, *argP1) ||
           this->IsKeyword(keySTREQUAL, *argP1))) {
        def = this->GetVariableOrString(*arg);
        def2 = this->GetVariableOrString(*argP2);
        int val = strcmp(def, def2);
        bool result;
        if (*(argP1) == keySTRLESS) {
          result = (val < 0);
        } else if (*(argP1) == keySTRLESS_EQUAL) {
          result = (val <= 0);
        } else if (*(argP1) == keySTRGREATER) {
          result = (val > 0);
        } else if (*(argP1) == keySTRGREATER_EQUAL) {
          result = (val >= 0);
        } else // strequal
        {
          result = (val == 0);
        }
        this->HandleBinaryOp(result, reducible, arg, newArgs, argP1, argP2);
      }

      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
          (this->IsKeyword(keyVERSION_LESS, *argP1) ||
           this->IsKeyword(keyVERSION_LESS_EQUAL, *argP1) ||
           this->IsKeyword(keyVERSION_GREATER, *argP1) ||
           this->IsKeyword(keyVERSION_GREATER_EQUAL, *argP1) ||
           this->IsKeyword(keyVERSION_EQUAL, *argP1))) {
        def = this->GetVariableOrString(*arg);
        def2 = this->GetVariableOrString(*argP2);
        cmSystemTools::CompareOp op;
        if (*argP1 == keyVERSION_LESS) {
          op = cmSystemTools::OP_LESS;
        } else if (*argP1 == keyVERSION_LESS_EQUAL) {
          op = cmSystemTools::OP_LESS_EQUAL;
        } else if (*argP1 == keyVERSION_GREATER) {
          op = cmSystemTools::OP_GREATER;
        } else if (*argP1 == keyVERSION_GREATER_EQUAL) {
          op = cmSystemTools::OP_GREATER_EQUAL;
        } else { // version_equal
          op = cmSystemTools::OP_EQUAL;
        }
        bool result = cmSystemTools::VersionCompare(op, def, def2);
        this->HandleBinaryOp(result, reducible, arg, newArgs, argP1, argP2);
      }

      // is file A newer than file B
      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
          this->IsKeyword(keyIS_NEWER_THAN, *argP1)) {
        int fileIsNewer = 0;
        bool success = cmSystemTools::FileTimeCompare(
          arg->GetValue(), (argP2)->GetValue(), &fileIsNewer);
        this->HandleBinaryOp(
          (!success || fileIsNewer == 1 || fileIsNewer == 0), reducible, arg,
          newArgs, argP1, argP2);
      }

      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
          this->IsKeyword(keyIN_LIST, *argP1)) {
        if (this->Policy57Status != cmPolicies::OLD &&
            this->Policy57Status != cmPolicies::WARN) {
          bool result = false;

          def = this->GetVariableOrString(*arg);
          def2 = this->Makefile.GetDefinition(argP2->GetValue());

          if (def2) {
            std::vector<std::string> list;
            cmSystemTools::ExpandListArgument(def2, list, true);

            result = std::find(list.begin(), list.end(), def) != list.end();
          }

          this->HandleBinaryOp(result, reducible, arg, newArgs, argP1, argP2);
        } else if (this->Policy57Status == cmPolicies::WARN) {
          std::ostringstream e;
          e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0057) << "\n";
          e << "IN_LIST will be interpreted as an operator "
               "when the policy is set to NEW.  "
               "Since the policy is not set the OLD behavior will be used.";

          this->Makefile.IssueMessage(MessageType::AUTHOR_WARNING, e.str());
        }
      }

      ++arg;
    }
  } while (reducible);
  return true;
}